

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

CallReaction testing::Mock::GetReactionOnUninterestingCalls(void *mock_obj)

{
  CallReaction CVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  void *mock_obj_local;
  
  mock_obj_local = mock_obj;
  sVar2 = std::
          map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
          ::count((map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
                   *)(anonymous_namespace)::g_uninteresting_call_reaction,&mock_obj_local);
  if (sVar2 == 0) {
    CVar1 = kWarn;
    if (FLAGS_gmock_default_mock_behavior < (kFail|kWarn)) {
      CVar1 = FLAGS_gmock_default_mock_behavior;
    }
  }
  else {
    pmVar3 = std::
             map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
             ::operator[]((map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
                           *)(anonymous_namespace)::g_uninteresting_call_reaction,&mock_obj_local);
    CVar1 = *pmVar3;
  }
  return CVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  return (g_uninteresting_call_reaction.count(mock_obj) == 0) ?
      internal::intToCallReaction(GMOCK_FLAG(default_mock_behavior)) :
      g_uninteresting_call_reaction[mock_obj];
}